

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_assert.cpp
# Opt level: O0

void lzham_fail(char *pExp,char *pFile,uint line)

{
  bool bVar1;
  uint in_EDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  char buf [512];
  char acStack_218 [224];
  
  sprintf_s(acStack_218,0x200,"%s(%u): Failure: \"%s\"\n",in_RSI,(ulong)in_EDX,in_RDI);
  lzham_output_debug_string((char *)0x106d04);
  printf("%s",acStack_218);
  bVar1 = lzham_is_debugger_present();
  if (bVar1) {
    lzham_debug_break();
  }
  if ((g_exit_on_failure & 1U) == 0) {
    return;
  }
  exit(1);
}

Assistant:

void lzham_fail(const char* pExp, const char* pFile, unsigned line)
{
   char buf[512];

   sprintf_s(buf, sizeof(buf), "%s(%u): Failure: \"%s\"\n", pFile, line, pExp);

   lzham_output_debug_string(buf);

   printf("%s", buf);

   if (lzham_is_debugger_present())
      lzham_debug_break();

#if LZHAM_USE_WIN32_API
   if (g_fail_exceptions)
      RaiseException(LZHAM_FAIL_EXCEPTION_CODE, 0, 0, NULL);
   else
#endif
   if (g_exit_on_failure)
      exit(EXIT_FAILURE);
}